

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  u8 *puVar1;
  char *pcVar2;
  ushort *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  ushort *puVar9;
  ushort *__dest;
  ulong uVar10;
  ushort *__src;
  ushort *puVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  uVar10 = (ulong)pPg->hdrOffset;
  puVar1 = pPg->aData;
  uVar7 = pPg->pBt->usableSize;
  puVar11 = (ushort *)(puVar1 + (int)uVar7);
  puVar9 = (ushort *)pPg->aCellIdx;
  uVar12 = 0;
  uVar6 = (uint)(ushort)(*(ushort *)(puVar1 + uVar10 + 5) << 8 |
                        *(ushort *)(puVar1 + uVar10 + 5) >> 8);
  if (uVar6 <= uVar7) {
    uVar12 = (ulong)uVar6;
  }
  pcVar2 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar2 + uVar12,puVar1 + uVar12,(ulong)(uVar7 - (int)uVar12));
  uVar4 = 0xffffffffffffffff;
  do {
    uVar5 = uVar4 + 1;
    lVar13 = uVar4 + 1;
    uVar4 = uVar5;
  } while (pCArray->ixNx[lVar13] <= iFirst);
  lVar13 = (long)iFirst;
  uVar4 = uVar5 & 0xffffffff;
  __dest = puVar11;
  do {
    puVar3 = (ushort *)pCArray->apEnd[uVar5];
    do {
      __src = (ushort *)pCArray->apCell[lVar13];
      uVar5 = (ulong)pCArray->szCell[lVar13];
      if ((__src < puVar1 + uVar12) || (puVar11 <= __src)) {
        if ((__src < puVar3) && (puVar3 < (ushort *)((long)__src + uVar5))) {
          uVar8 = 0x13231;
          goto LAB_00158890;
        }
      }
      else {
        if (puVar11 < (ushort *)((long)__src + uVar5)) {
          uVar8 = 0x1322c;
          goto LAB_00158890;
        }
        __src = (ushort *)((long)__src + ((long)pcVar2 - (long)puVar1));
      }
      __dest = (ushort *)((long)__dest - uVar5);
      lVar14 = (long)__dest - (long)puVar1;
      *puVar9 = (ushort)lVar14 << 8 | (ushort)lVar14 >> 8;
      puVar9 = puVar9 + 1;
      if (__dest < puVar9) {
        uVar8 = 0x13237;
LAB_00158890:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        return 0xb;
      }
      memmove(__dest,__src,uVar5);
      lVar13 = lVar13 + 1;
      if (nCell + iFirst <= lVar13) {
        pPg->nCell = (u16)nCell;
        pPg->nOverflow = '\0';
        (puVar1 + uVar10 + 1)[0] = '\0';
        (puVar1 + uVar10 + 1)[1] = '\0';
        puVar1[uVar10 + 3] = *(u8 *)((long)&pPg->nCell + 1);
        puVar1[uVar10 + 4] = (u8)pPg->nCell;
        puVar1[uVar10 + 5] = (u8)((ulong)lVar14 >> 8);
        puVar1[uVar10 + 6] = (u8)lVar14;
        puVar1[uVar10 + 7] = '\0';
        return 0;
      }
    } while (lVar13 < pCArray->ixNx[(int)uVar4]);
    uVar7 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar7;
    uVar5 = (ulong)(int)uVar7;
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( nCell>0 );
  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( j>(u32)usableSize ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  assert( pCArray->ixNx[NB*2-1]>i );
  for(k=0; pCArray->ixNx[k]<=i; k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData+j,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memmove(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}